

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

bool __thiscall
ON_RenderContentPrivate::SetChild
          (ON_RenderContentPrivate *this,ON_RenderContent *child,wchar_t *child_slot_name)

{
  ON_RenderContentPrivate *this_00;
  bool bVar1;
  int iVar2;
  ON_RenderContent *pOVar3;
  ON_XMLVariant OStack_128;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (child != (ON_RenderContent *)0x0) {
    this_00 = child->_private;
    if (this_00->m_model == (ONX_Model *)0x0) {
      bVar1 = false;
      if ((child_slot_name == (wchar_t *)0x0) || (this_00->m_parent != (ON_RenderContent *)0x0))
      goto LAB_005a2f39;
      if (*child_slot_name != L'\0') {
        ::ON_XMLVariant::ON_XMLVariant(&OStack_128,child_slot_name);
        SetPropertyValue(this_00,L"child-slot-name",&OStack_128);
        ::ON_XMLVariant::~ON_XMLVariant(&OStack_128);
        goto LAB_005a2ed4;
      }
    }
    bVar1 = false;
    goto LAB_005a2f39;
  }
LAB_005a2ed4:
  pOVar3 = FindChild(this,child_slot_name);
  if (pOVar3 == (ON_RenderContent *)0x0) {
    if (child != (ON_RenderContent *)0x0) {
      bVar1 = AddChild(this,child);
      if (!bVar1) goto LAB_005a2f39;
      goto LAB_005a2efe;
    }
  }
  else {
    bVar1 = ChangeChild(this,pOVar3,child);
    if (child == (ON_RenderContent *)0x0 || !bVar1) goto LAB_005a2f39;
LAB_005a2efe:
    pOVar3 = TopLevel(this);
    child->_private->m_model = pOVar3->_private->m_model;
  }
  bVar1 = true;
LAB_005a2f39:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return bVar1;
}

Assistant:

bool ON_RenderContentPrivate::SetChild(ON_RenderContent* child, const wchar_t* child_slot_name)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  if (nullptr != child)
  {
    if (nullptr != child->_private->m_model)
      return false;

    if (nullptr != child->_private->m_parent)
      return false;

    if ((nullptr == child_slot_name) || (0 == child_slot_name[0]))
      return false;

    child->_private->SetPropertyValue(ON_RENDER_CONTENT_CHILD_SLOT_NAME, child_slot_name);
  }

  // Get any existing child with the same child slot name (may be null).
  auto* existing_child = FindChild(child_slot_name);
  if (nullptr != existing_child)
  {
    // There is an existing child with the same child slot name; replace it.
    if (!ChangeChild(existing_child, child)) // Deletes existing_child.
      return false;
  }
  else
  {
    // No existing child; just add the new one.
    if (nullptr != child)
    {
      if (!AddChild(*child))
        return false;
    }
  }

  if (nullptr != child)
  {
    auto* pModel = TopLevel()._private->m_model;
    child->_private->m_model = pModel;
  }

  return true;
}